

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O0

int __thiscall
QAbstractItemViewPrivate::delegateRefCount
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  long lVar1;
  bool bVar2;
  QPointer<QAbstractItemDelegate> *lhs;
  long in_RDI;
  long in_FS_OFFSET;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *delegates;
  int maps;
  int ref;
  const_iterator it;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QPointer<QAbstractItemDelegate> *in_stack_ffffffffffffffb0;
  QPointer<QAbstractItemDelegate> *this_00;
  int local_38;
  uint local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::operator==(in_stack_ffffffffffffffb0,
                       (QAbstractItemDelegate **)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_34 = (uint)bVar2;
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    if (local_38 == 0) {
      lhs = (QPointer<QAbstractItemDelegate> *)(in_RDI + 0x310);
    }
    else {
      lhs = (QPointer<QAbstractItemDelegate> *)(in_RDI + 0x318);
    }
    this_00 = lhs;
    QMap<int,_QPointer<QAbstractItemDelegate>_>::begin
              ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)lhs);
    while( true ) {
      QMap<int,_QPointer<QAbstractItemDelegate>_>::end
                ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)this_00);
      bVar2 = ::operator!=((const_iterator *)lhs,
                           (const_iterator *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (!bVar2) break;
      QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::value((const_iterator *)0x816a03)
      ;
      bVar2 = ::operator==(lhs,(QAbstractItemDelegate **)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((bVar2) && (local_34 = local_34 + 1, 1 < (int)local_34)) goto LAB_00816a5c;
      QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator++((const_iterator *)lhs)
      ;
    }
  }
LAB_00816a5c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

int delegateRefCount(const QAbstractItemDelegate *delegate) const
    {
        int ref = 0;
        if (itemDelegate == delegate)
            ++ref;

        for (int maps = 0; maps < 2; ++maps) {
            const QMap<int, QPointer<QAbstractItemDelegate> > *delegates = maps ? &columnDelegates : &rowDelegates;
            for (QMap<int, QPointer<QAbstractItemDelegate> >::const_iterator it = delegates->begin();
                it != delegates->end(); ++it) {
                    if (it.value() == delegate) {
                        ++ref;
                        // optimization, we are only interested in the ref count values 0, 1 or >=2
                        if (ref >= 2) {
                            return ref;
                        }
                    }
            }
        }
        return ref;
    }